

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

ColorFilterNode * rengine::ColorFilterNode::create(void)

{
  bool bVar1;
  ColorFilterNode *t;
  Node *local_10;
  
  bVar1 = AllocationPool<rengine::ColorFilterNode>::isExhausted
                    (&__allocation_pool_rengine_ColorFilterNode);
  if (bVar1) {
    local_10 = (Node *)operator_new(0x78);
    ColorFilterNode((ColorFilterNode *)local_10);
  }
  else {
    local_10 = &AllocationPool<rengine::ColorFilterNode>::allocate
                          (&__allocation_pool_rengine_ColorFilterNode)->super_Node;
    Node::__mark_as_pool_allocated(local_10);
  }
  return (ColorFilterNode *)local_10;
}

Assistant:

ColorFilterNode *create(mat4 matrix) {
        auto node = create();
        node->setColorMatrix(matrix);
        return node;
    }